

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_array_slowpath(uint8_t c,char **data)

{
  uint uVar1;
  uint *puVar2;
  
  puVar2 = (uint *)*data;
  if ((c & 1) != 0) {
    uVar1 = *puVar2;
    *data = (char *)(puVar2 + 1);
    return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar1 = *puVar2;
  *data = (char *)((long)puVar2 + 2);
  return (uint32_t)(ushort)((ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
}

Assistant:

MP_IMPL uint32_t
mp_decode_array_slowpath(uint8_t c, const char **data)
{
	uint32_t size;
	switch (c & 0x1) {
	case 0xdc & 0x1:
		size = mp_load_u16(data);
		return size;
	case 0xdd & 0x1:
		size = mp_load_u32(data);
		return size;
	default:
		mp_unreachable();
	}
}